

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::ResourceBuffer::ResourceBuffer
          (ResourceBuffer *this,ifstream *ifs,uint32_t offset,uint32_t size)

{
  pointer pcVar1;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__ResourceBuffer_0011b9c8;
  (this->vMemory).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vMemory).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vMemory).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&this->vMemory,(ulong)size);
  std::istream::seekg(ifs,offset,0);
  std::istream::read((char *)ifs,
                     (long)(this->vMemory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  pcVar1 = (this->vMemory).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(pointer *)&this->field_0x8 = pcVar1;
  *(pointer *)&this->field_0x10 = pcVar1;
  *(pointer *)&this->field_0x18 = pcVar1 + size;
  return;
}

Assistant:

ResourceBuffer::ResourceBuffer(std::ifstream& ifs, uint32_t offset, uint32_t size)
	{
		vMemory.resize(size);
		ifs.seekg(offset); ifs.read(vMemory.data(), vMemory.size());
		setg(vMemory.data(), vMemory.data(), vMemory.data() + size);
	}